

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkPredict_MaximumOrder(ARKodeMem ark_mem,realtype tau,N_Vector yguess)

{
  int iVar1;
  char *msgfmt;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "ARKodeMem structure is NULL";
    ark_mem = (ARKodeMem)0x0;
  }
  else {
    if (ark_mem->interp != (ARKInterp)0x0) {
      iVar1 = arkInterpEvaluate(ark_mem,ark_mem->interp,tau,0,5,yguess);
      return iVar1;
    }
    msgfmt = "ARKodeInterpMem structure is NULL";
  }
  arkProcessError(ark_mem,-0x15,"ARKode","arkPredict_MaximumOrder",msgfmt);
  return -0x15;
}

Assistant:

int arkPredict_MaximumOrder(ARKodeMem ark_mem, realtype tau, N_Vector yguess)
{

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPredict_MaximumOrder",
                    "ARKodeMem structure is NULL");
    return(ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkPredict_MaximumOrder",
                    "ARKodeInterpMem structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* call the interpolation module to do the work */
  return(arkInterpEvaluate(ark_mem, ark_mem->interp, tau,
                           0, ARK_INTERP_MAX_DEGREE, yguess));
}